

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glucose.cpp
# Opt level: O2

void __thiscall Gluco::Solver::analyzeFinal(Solver *this,Lit p,vec<Gluco::Lit> *out_conflict)

{
  int iVar1;
  Ref r;
  VarData *pVVar2;
  undefined8 in_RAX;
  uint *puVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  undefined8 local_38;
  
  local_38 = CONCAT44((int)((ulong)in_RAX >> 0x20),p.x);
  if (out_conflict->data != (Lit *)0x0) {
    out_conflict->sz = 0;
  }
  vec<Gluco::Lit>::push(out_conflict,(Lit *)&local_38);
  if ((this->trail_lim).sz != 0) {
    (this->seen).data[local_38._0_4_ >> 1] = '\x01';
    lVar7 = (long)(this->trail).sz;
    while (*(this->trail_lim).data < lVar7) {
      iVar1 = (this->trail).data[lVar7 + -1].x;
      lVar7 = lVar7 + -1;
      iVar5 = iVar1 >> 1;
      if ((this->seen).data[iVar5] != '\0') {
        pVVar2 = (this->vardata).data;
        r = pVVar2[iVar5].reason;
        if (r == 0xffffffff) {
          if (pVVar2[iVar5].level < 1) {
            __assert_fail("level(x) > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/glucose/Glucose.cpp"
                          ,0x2fb,"void Gluco::Solver::analyzeFinal(Lit, vec<Lit> &)");
          }
          local_38 = CONCAT44(iVar1,local_38._0_4_) ^ 0x100000000;
          vec<Gluco::Lit>::push(out_conflict,(Lit *)((long)&local_38 + 4));
        }
        else {
          puVar3 = RegionAllocator<unsigned_int>::operator[]
                             (&(this->ca).super_RegionAllocator<unsigned_int>,r);
          lVar4 = *(long *)puVar3;
          for (uVar6 = (ulong)((int)((ulong)lVar4 >> 0x20) != 2); (long)uVar6 < lVar4 >> 0x20;
              uVar6 = uVar6 + 1) {
            if (0 < (this->vardata).data[(int)puVar3[uVar6 + 3] >> 1].level) {
              (this->seen).data[(int)puVar3[uVar6 + 3] >> 1] = '\x01';
              lVar4 = *(long *)puVar3;
            }
          }
        }
        (this->seen).data[iVar5] = '\0';
      }
    }
    (this->seen).data[local_38._0_4_ >> 1] = '\0';
  }
  return;
}

Assistant:

void Solver::analyzeFinal(Lit p, vec<Lit>& out_conflict)
{
    out_conflict.clear();
    out_conflict.push(p);

    if (decisionLevel() == 0)
        return;

    seen[var(p)] = 1;

    for (int i = trail.size()-1; i >= trail_lim[0]; i--){
        Var x = var(trail[i]);
        if (seen[x]){
            if (reason(x) == CRef_Undef){
                assert(level(x) > 0);
                out_conflict.push(~trail[i]);
            }else{
                Clause& c = ca[reason(x)];
                //                for (int j = 1; j < c.size(); j++) Minisat (glucose 2.0) loop 
                // Bug in case of assumptions due to special data structures for Binary.
                // Many thanks to Sam Bayless (sbayless@cs.ubc.ca) for discover this bug.
                for (int j = ((c.size()==2) ? 0:1); j < c.size(); j++)
                    if (level(var(c[j])) > 0)
                        seen[var(c[j])] = 1;
            }  

            seen[x] = 0;
        }
    }

    seen[var(p)] = 0;
}